

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::UncommittedRegionsAccessTestCase::iterate(UncommittedRegionsAccessTestCase *this)

{
  ostringstream *this_00;
  uint *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar6;
  uint *puVar7;
  uint *puVar8;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  uint *puVar9;
  uint *puVar10;
  uint level;
  GLuint texture;
  bool local_1f5;
  GLuint local_1f4;
  uint *local_1f0;
  string *local_1e8;
  Functions *local_1e0;
  ostream *local_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  Functions *pFVar5;
  
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_SparseTexture2CommitmentTestCase).
                      super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->m_contextInfo
                     ,"GL_ARB_sparse_texture2");
  if (bVar2) {
    iVar3 = (*((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
               super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pFVar5 = (Functions *)CONCAT44(extraout_var,iVar3);
    puVar9 = (uint *)(this->super_SparseTexture2CommitmentTestCase).
                     super_SparseTextureCommitmentTestCase.mSupportedTargets.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
    puVar7 = (uint *)(this->super_SparseTexture2CommitmentTestCase).
                     super_SparseTextureCommitmentTestCase.mSupportedTargets.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish;
    if (puVar9 != puVar7) {
      local_1e8 = (string *)
                  &(this->super_SparseTexture2CommitmentTestCase).
                   super_SparseTextureCommitmentTestCase.field_0x90;
      local_1d8 = (ostream *)
                  &(this->super_SparseTexture2CommitmentTestCase).
                   super_SparseTextureCommitmentTestCase.field_0x88;
      puVar8 = (uint *)(this->super_SparseTexture2CommitmentTestCase).
                       super_SparseTextureCommitmentTestCase.mSupportedInternalFormats.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_finish;
      local_1f5 = true;
      local_1e0 = pFVar5;
      do {
        puVar10 = (uint *)(this->super_SparseTexture2CommitmentTestCase).
                          super_SparseTextureCommitmentTestCase.mSupportedInternalFormats.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
        puVar1 = puVar9;
        if (puVar10 != puVar8) {
          do {
            local_1f0 = puVar1;
            iVar3 = (*(this->super_SparseTexture2CommitmentTestCase).
                      super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                      super_TestNode._vptr_TestNode[6])(this,(ulong)*puVar9,(ulong)*puVar10);
            if ((char)iVar3 != '\0') {
              local_1b0._0_8_ = local_1a0;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,0x1af8059);
              std::__cxx11::stringbuf::str(local_1e8);
              if ((TestLog *)local_1b0._0_8_ != local_1a0) {
                operator_delete((void *)local_1b0._0_8_,
                                (ulong)((long)&(local_1a0[0].m_log)->flags + 1));
              }
              poVar6 = local_1d8;
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_1d8,"Testing uncommitted regions access for target: ",0x2f);
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,*puVar9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,", format: ",10);
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,*puVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," - ",3);
              (*(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase
                .super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[8])
                        (this,pFVar5,(ulong)*puVar9,(ulong)*puVar10,&local_1f4,3);
              if (0 < (this->super_SparseTexture2CommitmentTestCase).
                      super_SparseTextureCommitmentTestCase.mState.levels) {
                iVar3 = 1;
                do {
                  pFVar5 = local_1e0;
                  level = iVar3 - 1;
                  iVar4 = (*(this->super_SparseTexture2CommitmentTestCase).
                            super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                            super_TestNode._vptr_TestNode[0xc])
                                    (this,local_1e0,(ulong)*puVar9,(ulong)*puVar10,&local_1f4,
                                     (ulong)level);
                  if ((char)iVar4 != '\0') {
                    (*(this->super_SparseTexture2CommitmentTestCase).
                      super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                      super_TestNode._vptr_TestNode[10])
                              (this,pFVar5,(ulong)*local_1f0,(ulong)*puVar10,&local_1f4,(ulong)level
                              );
                    if (((local_1f5 == false) ||
                        (bVar2 = UncommittedReads(this,pFVar5,*local_1f0,*puVar10,&local_1f4,level),
                        !bVar2)) ||
                       (bVar2 = UncommittedAtomicOperations
                                          (this,pFVar5,*local_1f0,*puVar10,&local_1f4,level), !bVar2
                       )) {
                      gl4cts::Texture::Delete(pFVar5,&local_1f4);
                      goto LAB_00a65aa0;
                    }
                    local_1f5 = UncommittedDepthStencil
                                          (this,pFVar5,*local_1f0,*puVar10,&local_1f4,level);
                  }
                  puVar9 = local_1f0;
                } while ((local_1f5 != false) &&
                        (bVar2 = iVar3 < (this->super_SparseTexture2CommitmentTestCase).
                                         super_SparseTextureCommitmentTestCase.mState.levels,
                        iVar3 = iVar3 + 1, bVar2));
              }
              pFVar5 = local_1e0;
              gl4cts::Texture::Delete(local_1e0,&local_1f4);
              if (local_1f5 == false) {
LAB_00a65aa0:
                local_1b0._0_8_ =
                     ((this->super_SparseTexture2CommitmentTestCase).
                      super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log;
                this_00 = (ostringstream *)(local_1b0 + 8);
                std::__cxx11::ostringstream::ostringstream(this_00);
                std::__cxx11::stringbuf::str();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this_00,(char *)local_1d0,local_1c8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Fail",4);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                if (local_1d0 != local_1c0) {
                  operator_delete(local_1d0,local_1c0[0] + 1);
                }
                std::__cxx11::ostringstream::~ostringstream(this_00);
                std::ios_base::~ios_base(local_138);
                this_01 = (this->super_SparseTexture2CommitmentTestCase).
                          super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx;
                description = "Fail";
                testResult = QP_TEST_RESULT_FAIL;
                goto LAB_00a65b46;
              }
            }
            puVar8 = puVar10 + 1;
            puVar10 = puVar8;
            puVar1 = local_1f0;
          } while (puVar8 != (uint *)(this->super_SparseTexture2CommitmentTestCase).
                                     super_SparseTextureCommitmentTestCase.mSupportedInternalFormats
                                     .super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish);
          puVar7 = (uint *)(this->super_SparseTexture2CommitmentTestCase).
                           super_SparseTextureCommitmentTestCase.mSupportedTargets.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
        }
        puVar9 = puVar9 + 1;
      } while (puVar9 != puVar7);
    }
    this_01 = (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
              super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    this_01 = (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
              super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
LAB_00a65b46:
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult UncommittedRegionsAccessTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture2"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool result = true;

	GLuint texture;

	for (std::vector<glw::GLint>::const_iterator iter = mSupportedTargets.begin(); iter != mSupportedTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::vector<glw::GLint>::const_iterator formIter = mSupportedInternalFormats.begin();
			 formIter != mSupportedInternalFormats.end(); ++formIter)
		{
			const GLint& format = *formIter;

			if (!caseAllowed(target, format))
				continue;

			mLog.str("");
			mLog << "Testing uncommitted regions access for target: " << target << ", format: " << format << " - ";

			sparseAllocateTexture(gl, target, format, texture, 3);
			for (int l = 0; l < mState.levels; ++l)
			{
				if (commitTexturePage(gl, target, format, texture, l))
				{
					writeDataToTexture(gl, target, format, texture, l);
					result = result && UncommittedReads(gl, target, format, texture, l);
					result = result && UncommittedAtomicOperations(gl, target, format, texture, l);
					result = result && UncommittedDepthStencil(gl, target, format, texture, l);
				}

				if (!result)
					break;
			}

			Texture::Delete(gl, texture);

			if (!result)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << mLog.str() << "Fail" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}